

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O1

void __thiscall
ConfidentialTxInReference_EstimateTxInSize_Test::TestBody
          (ConfidentialTxInReference_EstimateTxInSize_Test *this)

{
  ByteData *pBVar1;
  AddressType addr_type;
  int minimum_bits;
  void *pvVar2;
  pointer tx_in;
  bool bVar3;
  int iVar4;
  Script *scriptsig_template;
  char *pcVar5;
  long lVar6;
  initializer_list<TestEstimateConfidentialTxInRefVector> __l;
  AssertionResult gtest_ar;
  undefined1 local_24f8 [16];
  ByteData local_24e8;
  uint32_t wit_size;
  uint32_t size;
  AssertHelper local_24c8;
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  test_vector;
  Script script_template;
  BlindFactor blind_factor;
  BlindFactor entropy;
  ConfidentialValue issuance_amount;
  ConfidentialValue inflation_keys;
  Amount token_amount;
  Amount issue_amount;
  ConfidentialTxIn issue_txin;
  Script local_2260;
  ScriptWitness local_2228;
  ScriptWitness local_2208;
  ScriptWitness local_21e8;
  ScriptWitness local_21c8;
  ScriptWitness local_21a8;
  ScriptWitness local_2188;
  ConfidentialTxIn txin;
  ConfidentialTxIn pegin_txin;
  ConfidentialTxInReference txin_ref;
  Script local_1d38;
  Script local_1d00;
  bool local_1cc8;
  _Alloc_hider local_1cc0;
  char local_1cb0 [16];
  undefined8 local_1ca0;
  ConfidentialTxIn local_1c98;
  undefined8 local_1b38;
  undefined4 local_1b30;
  Script local_1b28;
  Script local_1af0;
  undefined1 local_1ab8;
  undefined1 *local_1ab0 [2];
  undefined1 local_1aa0 [16];
  undefined8 local_1a90;
  ConfidentialTxIn local_1a88;
  undefined8 local_1928;
  undefined4 local_1920;
  Script local_1918;
  Script local_18e0;
  undefined1 local_18a8;
  undefined1 *local_18a0 [2];
  undefined1 local_1890 [16];
  undefined8 local_1880;
  ConfidentialTxIn local_1878;
  undefined8 local_1718;
  undefined4 local_1710;
  Script local_1708;
  Script local_16d0;
  undefined1 local_1698;
  undefined1 *local_1690 [2];
  undefined1 local_1680 [16];
  undefined8 local_1670;
  ConfidentialTxIn local_1668;
  undefined8 local_1508;
  undefined4 local_1500;
  Script local_14f8;
  Script local_14c0;
  undefined1 local_1488;
  undefined1 *local_1480 [2];
  undefined1 local_1470 [16];
  undefined8 local_1460;
  ConfidentialTxIn local_1458;
  undefined8 local_12f8;
  undefined4 local_12f0;
  Script local_12e8;
  Script local_12b0;
  undefined1 local_1278;
  undefined1 *local_1270 [2];
  undefined1 local_1260 [16];
  undefined8 local_1250;
  ConfidentialTxIn local_1248;
  undefined8 local_10e8;
  undefined4 local_10e0;
  Script local_10d8;
  Script local_10a0;
  undefined1 local_1068;
  undefined1 *local_1060 [2];
  undefined1 local_1050 [16];
  undefined8 local_1040;
  ConfidentialTxIn local_1038;
  undefined8 local_ed8;
  undefined4 local_ed0;
  Script local_ec8;
  Script local_e90;
  undefined1 local_e58;
  undefined1 *local_e50 [2];
  undefined1 local_e40 [16];
  undefined8 local_e30;
  ConfidentialTxIn local_e28;
  undefined8 local_cc8;
  undefined4 local_cc0;
  Script local_cb8;
  Script local_c80;
  undefined1 local_c48;
  undefined1 *local_c40 [2];
  undefined1 local_c30 [16];
  undefined8 local_c20;
  ConfidentialTxIn local_c18;
  undefined8 local_ab8;
  undefined4 local_ab0;
  Script local_aa8;
  Script local_a70;
  undefined1 local_a38;
  undefined1 *local_a30 [2];
  undefined1 local_a20 [16];
  undefined8 local_a10;
  ConfidentialTxIn local_a08;
  undefined8 local_8a8;
  undefined4 local_8a0;
  Script local_898;
  Script local_860;
  undefined1 local_828;
  undefined1 *local_820 [2];
  undefined1 local_810 [16];
  undefined8 local_800;
  ConfidentialTxIn local_7f8;
  undefined8 local_698;
  undefined4 local_690;
  Script local_688;
  Script local_650;
  undefined1 local_618;
  undefined1 *local_610 [2];
  undefined1 local_600 [16];
  undefined8 local_5f0;
  ConfidentialTxIn local_5e8;
  undefined8 local_488;
  undefined4 local_480;
  Script local_478;
  Script local_440;
  undefined1 local_408;
  undefined1 *local_400 [2];
  undefined1 local_3f0 [16];
  undefined8 local_3e0;
  ConfidentialTxIn local_3d8;
  undefined8 local_278;
  undefined4 local_270;
  Script local_268;
  Script local_230;
  undefined1 local_1f8;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined8 local_1d0;
  Script local_1c8;
  ConfidentialTxIn reissue_txin;
  
  if ((TestBody()::multisig_script_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&TestBody()::multisig_script_abi_cxx11_), iVar4 != 0)) {
    TestBody()::multisig_script_abi_cxx11_._M_dataplus._M_p =
         (pointer)&TestBody()::multisig_script_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&TestBody()::multisig_script_abi_cxx11_,
               "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
               ,"");
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::multisig_script_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&TestBody()::multisig_script_abi_cxx11_);
  }
  if ((TestBody()::scriptsig_template_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&TestBody()::scriptsig_template_abi_cxx11_), iVar4 != 0)) {
    TestBody()::scriptsig_template_abi_cxx11_._M_dataplus._M_p =
         (pointer)&TestBody()::scriptsig_template_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&TestBody()::scriptsig_template_abi_cxx11_,
               "00473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb014752210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec552ae"
               ,"");
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::scriptsig_template_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&TestBody()::scriptsig_template_abi_cxx11_);
  }
  cfd::core::Amount::Amount(&issue_amount,10000000);
  cfd::core::Amount::Amount(&token_amount,10000000);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&txin);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&pegin_txin);
  pBVar1 = &txin_ref.super_AbstractTxInReference.txid_.data_;
  txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&txin_ref,"00e1f50500000000","");
  cfd::core::ByteData::ByteData((ByteData *)&issue_txin,(string *)&txin_ref);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_2188,&pegin_txin,(ByteData *)&issue_txin)
  ;
  local_2188._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_006940e8;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_2188.witness_stack_);
  if (issue_txin.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(issue_txin.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  if ((ByteData *)txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&txin_ref,"c23bd031406aa9f7ac994f7385cd8d2605adaadf5a473c82557b4586192681d3",
             "");
  cfd::core::ByteData::ByteData((ByteData *)&issue_txin,(string *)&txin_ref);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_21a8,&pegin_txin,(ByteData *)&issue_txin)
  ;
  local_21a8._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_006940e8;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_21a8.witness_stack_);
  if (issue_txin.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(issue_txin.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  if ((ByteData *)txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&txin_ref,"06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f",
             "");
  cfd::core::ByteData::ByteData((ByteData *)&issue_txin,(string *)&txin_ref);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_21c8,&pegin_txin,(ByteData *)&issue_txin)
  ;
  local_21c8._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_006940e8;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_21c8.witness_stack_);
  if (issue_txin.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(issue_txin.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  if ((ByteData *)txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&txin_ref,"0014e8d28b573816ddfcf98578d7b28543e273f5a72a","");
  cfd::core::ByteData::ByteData((ByteData *)&issue_txin,(string *)&txin_ref);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_21e8,&pegin_txin,(ByteData *)&issue_txin)
  ;
  local_21e8._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_006940e8;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_21e8.witness_stack_);
  if (issue_txin.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(issue_txin.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  if ((ByteData *)txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&txin_ref,
             "02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"
             ,"");
  cfd::core::ByteData::ByteData((ByteData *)&issue_txin,(string *)&txin_ref);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_2208,&pegin_txin,(ByteData *)&issue_txin)
  ;
  local_2208._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_006940e8;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_2208.witness_stack_);
  if (issue_txin.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(issue_txin.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  if ((ByteData *)txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&txin_ref,
             "03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"
             ,"");
  cfd::core::ByteData::ByteData((ByteData *)&issue_txin,(string *)&txin_ref);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_2228,&pegin_txin,(ByteData *)&issue_txin)
  ;
  local_2228._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_006940e8;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_2228.witness_stack_);
  if (issue_txin.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(issue_txin.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  if ((ByteData *)txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&issue_txin);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&reissue_txin);
  cfd::core::ConfidentialValue::ConfidentialValue(&issuance_amount,&issue_amount);
  cfd::core::ConfidentialValue::ConfidentialValue(&inflation_keys,&token_amount);
  txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&txin_ref,"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",
             "");
  cfd::core::BlindFactor::BlindFactor(&entropy,(string *)&txin_ref);
  if ((ByteData *)txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&txin_ref,"c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf",
             "");
  cfd::core::BlindFactor::BlindFactor(&blind_factor,(string *)&txin_ref);
  if ((ByteData *)txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  cfd::core::ByteData256::ByteData256((ByteData256 *)&txin_ref);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&script_template);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar);
  cfd::core::ByteData::ByteData((ByteData *)&test_vector);
  cfd::core::ConfidentialTxIn::SetIssuance
            (&issue_txin,(ByteData256 *)&txin_ref,(ByteData256 *)&script_template,&issuance_amount,
             &inflation_keys,(ByteData *)&gtest_ar,(ByteData *)&test_vector);
  if (test_vector.
      super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(test_vector.
                    super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (gtest_ar._0_8_ != 0) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if (script_template._vptr_Script != (_func_int **)0x0) {
    operator_delete(script_template._vptr_Script);
  }
  if (txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0) {
    operator_delete(txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  cfd::core::BlindFactor::GetData((ByteData256 *)&script_template,&entropy);
  cfd::core::BlindFactor::GetData((ByteData256 *)&gtest_ar,&blind_factor);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&txin_ref);
  cfd::core::ByteData::ByteData((ByteData *)&test_vector);
  cfd::core::ByteData::ByteData(&local_24e8);
  cfd::core::ConfidentialTxIn::SetIssuance
            (&reissue_txin,(ByteData256 *)&script_template,(ByteData256 *)&gtest_ar,&issuance_amount
             ,(ConfidentialValue *)&txin_ref,(ByteData *)&test_vector,&local_24e8);
  if ((long *)local_24e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_24e8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (test_vector.
      super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(test_vector.
                    super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  txin_ref.super_AbstractTxInReference._vptr_AbstractTxInReference =
       (_func_int **)&PTR__ConfidentialValue_006a2070;
  if (txin_ref.super_AbstractTxInReference.txid_._vptr_Txid != (_func_int **)0x0) {
    operator_delete(txin_ref.super_AbstractTxInReference.txid_._vptr_Txid);
  }
  if (gtest_ar._0_8_ != 0) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if (script_template._vptr_Script != (_func_int **)0x0) {
    operator_delete(script_template._vptr_Script);
  }
  cfd::core::ConfidentialTxIn::ConfidentialTxIn((ConfidentialTxIn *)&txin_ref,&txin);
  cfd::core::Script::Script(&local_1d38);
  cfd::core::Script::Script(&local_1d00);
  local_1cc8 = false;
  local_1cc0._M_p = local_1cb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1cc0,"");
  local_1ca0._0_4_ = 0;
  local_1ca0._4_4_ = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1c98,&txin);
  local_1b38 = 0xcd00000001;
  local_1b30 = 0;
  cfd::core::Script::Script(&local_1b28,&exp_script);
  cfd::core::Script::Script(&local_1af0);
  local_1ab8 = 0;
  local_1ab0[0] = local_1aa0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ab0,"");
  local_1a90 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1a88,&txin);
  local_1928 = 0xb000000006;
  local_1920 = 0x70;
  cfd::core::Script::Script(&local_1918);
  cfd::core::Script::Script(&local_18e0);
  local_18a8 = 0;
  local_18a0[0] = local_1890;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_18a0,"");
  local_1880 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1878,&txin);
  local_1718 = 0xde00000005;
  local_1710 = 0x92;
  script_template._vptr_Script =
       (_func_int **)
       &script_template.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)&script_template,"51","");
  cfd::core::Script::Script(&local_1708,(string *)&script_template);
  cfd::core::Script::Script(&local_16d0);
  local_1698 = 0;
  local_1690[0] = local_1680;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1690,"");
  local_1670 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1668,&txin);
  local_1508 = 0x9900000004;
  local_1500 = 0x70;
  cfd::core::Script::Script(&local_14f8);
  cfd::core::Script::Script(&local_14c0);
  local_1488 = 0;
  local_1480[0] = local_1470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1480,"");
  local_1460 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1458,&txin);
  local_12f8 = 0xd000000003;
  local_12f0 = 0xa7;
  cfd::core::Script::Script(&local_12e8,&exp_script);
  cfd::core::Script::Script(&local_12b0);
  local_1278 = 0;
  local_1270[0] = local_1260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1270,"");
  local_1250 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1248,&txin);
  local_10e8 = 0x12d00000003;
  local_10e0 = 0x104;
  cfd::core::Script::Script(&local_10d8,&TestBody()::multisig_script_abi_cxx11_);
  cfd::core::Script::Script(&local_10a0);
  local_1068 = 0;
  local_1060[0] = local_1050;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1060,"");
  local_1040 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1038,&txin);
  local_ed8 = 0xbf00000003;
  local_ed0 = 0x96;
  cfd::core::Script::Script(&local_ec8,&exp_script);
  cfd::core::Script::Script(&local_e90);
  local_e58 = 0;
  local_e50[0] = local_e40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e50,TestBody()::scriptsig_template_abi_cxx11_._M_dataplus._M_p,
             TestBody()::scriptsig_template_abi_cxx11_._M_dataplus._M_p +
             TestBody()::scriptsig_template_abi_cxx11_._M_string_length);
  local_e30 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_e28,&pegin_txin);
  local_cc8 = 0x28400000004;
  local_cc0 = 0x25b;
  cfd::core::Script::Script(&local_cb8);
  gtest_ar._0_8_ = local_24f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,
             "0020e8d28b573816ddfcf98578d7b28543e273f5a72a112233445566778899aabbccdd","");
  cfd::core::Script::Script(&local_c80,(string *)&gtest_ar);
  local_c48 = 0;
  local_c40[0] = local_c30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c40,"");
  local_c20 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_c18,&issue_txin);
  local_ab8 = 0x102f00000004;
  local_ab0 = 0xf84;
  cfd::core::Script::Script(&local_aa8);
  cfd::core::Script::Script(&local_a70);
  local_a38 = 1;
  local_a30[0] = local_a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"");
  local_a10 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_a08,&issue_txin);
  local_8a8 = 0x17b100000004;
  local_8a0 = 0x1706;
  cfd::core::Script::Script(&local_898);
  cfd::core::Script::Script(&local_860);
  local_828 = 1;
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"");
  local_800 = 0x2400000000;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_7f8,&issue_txin);
  local_698 = 0x21b300000004;
  local_690 = 0x2108;
  cfd::core::Script::Script(&local_688);
  cfd::core::Script::Script(&local_650);
  local_618 = 1;
  local_610[0] = local_600;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"");
  local_5f0 = 0x3400000000;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_5e8,&reissue_txin);
  local_488 = 0xc6600000004;
  local_480 = 0xbbb;
  cfd::core::Script::Script(&local_478);
  cfd::core::Script::Script(&local_440);
  local_408 = 1;
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"");
  local_3e0 = 0x2400000000;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_3d8,&reissue_txin);
  local_278 = 0x116700000004;
  local_270 = 0x10bc;
  cfd::core::Script::Script(&local_268);
  cfd::core::Script::Script(&local_230);
  local_1f8 = 1;
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"");
  local_1d0 = 0x3400000000;
  __l._M_len = 0xe;
  __l._M_array = (iterator)&txin_ref;
  std::
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  ::vector(&test_vector,__l,(allocator_type *)&local_24e8);
  lVar6 = 0x1ce0;
  do {
    pvVar2 = *(void **)((long)&pegin_txin.inflation_keys_rangeproof_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + lVar6);
    if ((void *)((long)&pegin_txin.pegin_witness_.witness_stack_.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar6) != pvVar2) {
      operator_delete(pvVar2);
    }
    cfd::core::Script::~Script
              ((Script *)
               ((long)&pegin_txin.inflation_keys_.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + lVar6 + 8));
    cfd::core::Script::~Script
              ((Script *)((long)&pegin_txin.issuance_amount_._vptr_ConfidentialValue + lVar6));
    cfd::core::ConfidentialTxIn::~ConfidentialTxIn
              ((ConfidentialTxIn *)
               ((long)&txin.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish + lVar6));
    lVar6 = lVar6 + -0x210;
  } while (lVar6 != 0);
  if ((undefined1 *)gtest_ar._0_8_ != local_24f8) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  tx_in = test_vector.
          super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (script_template._vptr_Script !=
      (_func_int **)
      &script_template.script_data_.data_.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete(script_template._vptr_Script);
    tx_in = test_vector.
            super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; tx_in != test_vector.
                  super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
                  ._M_impl.super__Vector_impl_data._M_finish; tx_in = tx_in + 1) {
    size = 0;
    wit_size = 0;
    cfd::core::Script::Script(&script_template,&tx_in->script_template);
    scriptsig_template = (Script *)(tx_in->script_template)._M_string_length;
    if (scriptsig_template != (Script *)0x0) {
      scriptsig_template = &script_template;
    }
    cfd::core::ConfidentialTxInReference::ConfidentialTxInReference(&txin_ref,&tx_in->txin);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        addr_type = tx_in->addr_type;
        cfd::core::Script::Script(&local_2260,&tx_in->redeem_script);
        bVar3 = tx_in->is_blind;
        iVar4 = tx_in->exponent;
        minimum_bits = tx_in->minimum_bits;
        cfd::core::Script::Script(&local_1c8,&tx_in->claim_script);
        size = cfd::core::ConfidentialTxInReference::EstimateTxInSize
                         (&txin_ref,addr_type,&local_2260,bVar3,iVar4,minimum_bits,&local_1c8,
                          scriptsig_template,&wit_size,(uint32_t *)0x0);
        cfd::core::Script::~Script(&local_1c8);
        cfd::core::Script::~Script(&local_2260);
      }
    }
    else {
      testing::Message::Message((Message *)&gtest_ar);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_24e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x1d9,
                 "Expected: (size = txin_ref.EstimateTxInSize( test_data.addr_type, test_data.redeem_script, test_data.is_blind, test_data.exponent, test_data.minimum_bits, test_data.claim_script, template_ptr, &wit_size, nullptr)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_24e8,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_24e8);
      if (gtest_ar._0_8_ != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (gtest_ar._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
        }
        gtest_ar.success_ = false;
        gtest_ar._1_7_ = 0;
      }
    }
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"size","test_data.size",&size,&tx_in->size);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_24e8);
      pcVar5 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_24c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x1da,pcVar5);
      testing::internal::AssertHelper::operator=(&local_24c8,(Message *)&local_24e8);
      testing::internal::AssertHelper::~AssertHelper(&local_24c8);
      if ((long *)local_24e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           ((long *)local_24e8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0)) {
          (**(code **)(*(long *)local_24e8.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 8))();
        }
        local_24e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"wit_size","test_data.witness_size",&wit_size,
               &tx_in->witness_size);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_24e8);
      pcVar5 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_24c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x1db,pcVar5);
      testing::internal::AssertHelper::operator=(&local_24c8,(Message *)&local_24e8);
      testing::internal::AssertHelper::~AssertHelper(&local_24c8);
      if ((long *)local_24e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           ((long *)local_24e8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0)) {
          (**(code **)(*(long *)local_24e8.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 8))();
        }
        local_24e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&txin_ref);
    cfd::core::Script::~Script(&script_template);
  }
  std::
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  ::~vector(&test_vector);
  blind_factor._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
  if (blind_factor.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(blind_factor.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  entropy._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0;
  if (entropy.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(entropy.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  inflation_keys._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
  if (inflation_keys.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(inflation_keys.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  issuance_amount._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
  if (issuance_amount.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(issuance_amount.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&reissue_txin);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&issue_txin);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&pegin_txin);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin);
  return;
}

Assistant:

TEST(ConfidentialTxInReference, EstimateTxInSize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";
  static const std::string scriptsig_template = "00473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb014752210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec552ae";

  Amount issue_amount(uint32_t{10000000});
  Amount token_amount(uint32_t{10000000});
  ConfidentialTxIn txin;
  ConfidentialTxIn pegin_txin;
  {
    pegin_txin.AddPeginWitnessStack(ByteData("00e1f50500000000"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "c23bd031406aa9f7ac994f7385cd8d2605adaadf5a473c82557b4586192681d3"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f"));
    pegin_txin.AddPeginWitnessStack(
        ByteData("0014e8d28b573816ddfcf98578d7b28543e273f5a72a"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"));
  }
  ConfidentialTxIn issue_txin;
  ConfidentialTxIn reissue_txin;
  ConfidentialValue issuance_amount(issue_amount);
  ConfidentialValue inflation_keys(token_amount);
  BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");
  BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
  {
    issue_txin.SetIssuance(
        ByteData256(), ByteData256(), issuance_amount,
        inflation_keys, ByteData(), ByteData());
    reissue_txin.SetIssuance(
        entropy.GetData(), blind_factor.GetData(), issuance_amount,
        ConfidentialValue(), ByteData(), ByteData());
  }

  const std::vector<TestEstimateConfidentialTxInRefVector> test_vector = {
    {txin, AddressType::kP2pkhAddress, 150, 0, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2shAddress, 205, 0, exp_script, Script(), false, "", 0, 0},
    {txin, AddressType::kP2shP2wpkhAddress, 176, 112, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2shP2wshAddress, 222, 146, Script("51"), Script(), false, "", 0, 0},
    {txin, AddressType::kP2wpkhAddress, 153, 112, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2wshAddress, 208, 167, exp_script,Script(), false, "", 0, 0},
    {txin, AddressType::kP2wshAddress, 301, 260, Script(multisig_script), Script(), false,
      "", 0, 0},
    {txin, AddressType::kP2wshAddress, 191, 150, exp_script, Script(), false,
      scriptsig_template, 0, 0},
    // pegin (input claim script)
    {pegin_txin, AddressType::kP2wpkhAddress, 644, 603, Script(),
     Script("0020e8d28b573816ddfcf98578d7b28543e273f5a72a112233445566778899aabbccdd"),
     false, "", 0, 0},
    // issue
    {issue_txin, AddressType::kP2wpkhAddress, 4143, 3972, Script(), Script(), true, "", 0, 0},
    {issue_txin, AddressType::kP2wpkhAddress, 6065, 5894, Script(), Script(), true, "", 0, 36},
    {issue_txin, AddressType::kP2wpkhAddress, 8627, 8456, Script(), Script(), true, "", 0, 52},
    // reissue
    {reissue_txin, AddressType::kP2wpkhAddress, 3174, 3003, Script(), Script(), true, "", 0, 36},
    {reissue_txin, AddressType::kP2wpkhAddress, 4455, 4284, Script(),Script(), true, "", 0, 52},
  };

  for (const auto& test_data : test_vector) {
    uint32_t size = 0;
    uint32_t wit_size = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    ConfidentialTxInReference txin_ref(test_data.txin);
    EXPECT_NO_THROW((size = txin_ref.EstimateTxInSize(
        test_data.addr_type, test_data.redeem_script, test_data.is_blind,
        test_data.exponent, test_data.minimum_bits, test_data.claim_script,
        template_ptr, &wit_size, nullptr)));
    EXPECT_EQ(size, test_data.size);
    EXPECT_EQ(wit_size, test_data.witness_size);
  }
}